

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_imbue_regeneration(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  short sVar1;
  bool bVar2;
  CClass *this;
  void *arg2;
  int iVar3;
  char *pcVar4;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  bVar2 = is_affected((CHAR_DATA *)vo,(int)gsn_atrophy);
  if (bVar2) {
    act("$n\'s body stops wasting away.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    send_to_char("Your body stops wasting away.\n\r",(CHAR_DATA *)vo);
    iVar3 = (int)gsn_atrophy;
  }
  else {
    iVar3 = skill_lookup("prevent healing");
    bVar2 = is_affected((CHAR_DATA *)vo,iVar3);
    if (bVar2) {
      act("$n\'s sickly looking complexion clears up.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
      send_to_char("You no longer feel so sick and weary.\n\r",(CHAR_DATA *)vo);
      pcVar4 = "prevent healing";
    }
    else {
      iVar3 = skill_lookup("wither");
      bVar2 = is_affected((CHAR_DATA *)vo,iVar3);
      if (!bVar2) {
        bVar2 = is_affected((CHAR_DATA *)vo,sn);
        if (bVar2) {
          if ((CHAR_DATA *)vo == ch) {
            pcVar4 = "You are already healing at an improved rate.\n\r";
          }
          else {
            pcVar4 = "They are already healing at an improved rate.\n\r";
          }
          send_to_char(pcVar4,ch);
          return;
        }
        init_affect(&local_90);
        local_90.where = 0;
        local_90.aftype = 4;
        local_90.type = (short)sn;
        local_90.location = 0x1d;
        sVar1 = (short)(level >> 0x1f);
        local_90.modifier = (short)(uint)((ulong)((long)level * 0x2e8ba2e9) >> 0x21) - sVar1;
        bVar2 = is_npc(ch);
        if (!bVar2) {
          this = ch->my_class;
          if ((this == (CClass *)0x0) &&
             ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
              (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
            this = CClass::GetClass(0);
          }
          iVar3 = CClass::GetIndex(this);
          if (iVar3 == 9) {
            local_90.modifier = local_90.modifier + 2;
          }
        }
        local_90.level = (short)level;
        local_90.duration = (short)(uint)((ulong)((long)level * 0x66666667) >> 0x21) - sVar1;
        local_90.mod_name = 0xf;
        affect_to_char((CHAR_DATA *)vo,&local_90);
        send_to_char("You feel your body warm with an inner health.\n\r",(CHAR_DATA *)vo);
        if ((CHAR_DATA *)vo != ch) {
          send_to_char("You boost their recuperation ability.\n\r",ch);
        }
        return;
      }
      if ((CHAR_DATA *)vo == ch) {
        send_to_char("Your emaciated body parts heal up.\n\r",ch);
        pcVar4 = "$n\'s emaciated body heals up.";
        arg2 = (void *)0x0;
      }
      else {
        act("$N\'s emaciated body heals up with your touch.",ch,(void *)0x0,vo,3);
        act("Your emaciated body heals up with $n\'s touch.",ch,(void *)0x0,vo,2);
        pcVar4 = "$N\'s emaciated body heals up with $n\'s touch.";
        arg2 = vo;
      }
      act(pcVar4,ch,(void *)0x0,arg2,(uint)((CHAR_DATA *)vo != ch));
      pcVar4 = "wither";
    }
    iVar3 = skill_lookup(pcVar4);
  }
  switchD_002dea30::default((CHAR_DATA *)vo,iVar3);
  return;
}

Assistant:

void spell_imbue_regeneration(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, gsn_atrophy))
	{
		act("$n's body stops wasting away.", victim, 0, 0, TO_ROOM);
		send_to_char("Your body stops wasting away.\n\r", victim);
		affect_strip(victim, gsn_atrophy);
		return;
	}

	if (is_affected(victim, skill_lookup("prevent healing")))
	{
		act("$n's sickly looking complexion clears up.", victim, 0, 0, TO_ROOM);
		send_to_char("You no longer feel so sick and weary.\n\r", victim);
		affect_strip(victim, skill_lookup("prevent healing"));
		return;
	}

	if (is_affected(victim, skill_lookup("wither")))
	{
		if (victim != ch)
		{
			act("$N's emaciated body heals up with your touch.", ch, 0, victim, TO_CHAR);
			act("Your emaciated body heals up with $n's touch.", ch, 0, victim, TO_VICT);
			act("$N's emaciated body heals up with $n's touch.", ch, 0, victim, TO_NOTVICT);
		}
		else
		{
			send_to_char("Your emaciated body parts heal up.\n\r", ch);
			act("$n's emaciated body heals up.", ch, 0, 0, TO_ROOM);
		}

		affect_strip(victim, skill_lookup("wither"));
		return;
	}

	if (is_affected(victim, sn))
	{
		if (victim == ch)
			send_to_char("You are already healing at an improved rate.\n\r", ch);
		else
			send_to_char("They are already healing at an improved rate.\n\r", ch);

		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_COMMUNE;
	af.type = sn;
	af.location = APPLY_REGENERATION;
	af.modifier = level / 11;

	if (!is_npc(ch) && ch->Class()->GetIndex() == CLASS_HEALER)
		af.modifier += 2;

	af.level = level;
	af.duration = level / 5;
	af.mod_name = MOD_REGEN;
	affect_to_char(victim, &af);

	send_to_char("You feel your body warm with an inner health.\n\r", victim);

	if (victim != ch)
		send_to_char("You boost their recuperation ability.\n\r", ch);
}